

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_SamePackageUnusedImportError_Test::
TestBody(ValidationErrorTest_SamePackageUnusedImportError_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_90
  ;
  allocator<char> local_61;
  string local_60;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  ValidationErrorTest_SamePackageUnusedImportError_Test *local_10;
  ValidationErrorTest_SamePackageUnusedImportError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,
             "\n    name: \"unused_dependency.proto\"\n    package: \"proto2_unittest.subpackage\"\n    message_type { name: \"Foo\" }\n  "
            );
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    name: \"used_dependency.proto\"\n    package: \"proto2_unittest.subpackage\"\n    message_type { name: \"Bar\" }\n  "
            );
  ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"import.proto")
  ;
  DescriptorPool::AddDirectInputFile(&(this->super_ValidationErrorTest).pool_,local_40,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "\n                        name: \"import.proto\"\n                        package: \"proto2_unittest\"\n                        dependency: \"unused_dependency.proto\"\n                        dependency: \"used_dependency.proto\"\n                        message_type {\n                          name: \"Baz\"\n                          field {\n                            name: \"bar\"\n                            number: 1\n                            label: LABEL_OPTIONAL\n                            type: TYPE_MESSAGE\n                            type_name: \"subpackage.Bar\"\n                          }\n                        }\n                      "
             ,&local_61);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_90,
            "import.proto: unused_dependency.proto: IMPORT: Import unused_dependency.proto is unused.\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_60,&local_90);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_90);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, SamePackageUnusedImportError) {
  BuildFile(R"pb(
    name: "unused_dependency.proto"
    package: "proto2_unittest.subpackage"
    message_type { name: "Foo" }
  )pb");

  BuildFile(R"pb(
    name: "used_dependency.proto"
    package: "proto2_unittest.subpackage"
    message_type { name: "Bar" }
  )pb");

  pool_.AddDirectInputFile("import.proto", true);
  BuildFileWithErrors(R"pb(
                        name: "import.proto"
                        package: "proto2_unittest"
                        dependency: "unused_dependency.proto"
                        dependency: "used_dependency.proto"
                        message_type {
                          name: "Baz"
                          field {
                            name: "bar"
                            number: 1
                            label: LABEL_OPTIONAL
                            type: TYPE_MESSAGE
                            type_name: "subpackage.Bar"
                          }
                        }
                      )pb",
                      "import.proto: unused_dependency.proto: "
                      "IMPORT: Import unused_dependency.proto is unused.\n");
}